

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

bool __thiscall
Json::BuiltStyledStreamWriter::isMultineArray(BuiltStyledStreamWriter *this,Value *value)

{
  ArrayIndex AVar1;
  ArrayIndex AVar2;
  Value *pVVar3;
  ArrayIndex index;
  ArrayIndex index_00;
  long lVar4;
  uint uVar5;
  byte bVar6;
  bool bVar7;
  ArrayIndex index_1;
  ulong uVar8;
  bool bVar9;
  
  AVar1 = Value::size(value);
  bVar9 = this->rightMargin_ <= AVar1 * 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->childValues_);
  index_00 = 0;
  do {
    if ((AVar1 <= index_00) || (bVar9)) {
      bVar7 = true;
      if (!bVar9) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(&this->childValues_,(ulong)AVar1);
        this->field_0xd8 = this->field_0xd8 | 1;
        uVar5 = AVar1 * 2 + 2;
        lVar4 = 8;
        bVar6 = 0;
        for (uVar8 = 0; AVar1 != uVar8; uVar8 = uVar8 + 1) {
          pVVar3 = Value::operator[](value,(ArrayIndex)uVar8);
          bVar9 = hasCommentForValue(pVVar3);
          bVar6 = bVar6 | bVar9;
          pVVar3 = Value::operator[](value,(ArrayIndex)uVar8);
          writeValue(this,pVVar3);
          uVar5 = uVar5 + *(int *)((long)&(((this->childValues_).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar4);
          lVar4 = lVar4 + 0x20;
        }
        this->field_0xd8 = this->field_0xd8 & 0xfe;
        bVar7 = (bool)(bVar6 | this->rightMargin_ <= uVar5);
      }
      return bVar7;
    }
    pVVar3 = Value::operator[](value,index_00);
    bVar9 = Value::isArray(pVVar3);
    if (bVar9) {
LAB_003c08d8:
      AVar2 = Value::size(pVVar3);
      bVar9 = AVar2 != 0;
    }
    else {
      bVar9 = Value::isObject(pVVar3);
      if (bVar9) goto LAB_003c08d8;
      bVar9 = false;
    }
    index_00 = index_00 + 1;
  } while( true );
}

Assistant:

bool BuiltStyledStreamWriter::isMultineArray(Value const& value) {
  ArrayIndex const size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (ArrayIndex index = 0; index < size && !isMultiLine; ++index) {
    Value const& childValue = value[index];
    isMultiLine = ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    ArrayIndex lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (ArrayIndex index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += static_cast<ArrayIndex>(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}